

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::RunningSection::hasUntestedSections(RunningSection *this)

{
  bool bVar1;
  pointer ppRVar2;
  bool bVar3;
  
  bVar1 = true;
  if (this->m_state != Unknown) {
    ppRVar2 = (this->m_subSections).
              super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      bVar3 = ppRVar2 ==
              (this->m_subSections).
              super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
      bVar1 = !bVar3;
      if (bVar3) {
        return bVar1;
      }
      bVar3 = hasUntestedSections(*ppRVar2);
      ppRVar2 = ppRVar2 + 1;
    } while (!bVar3);
  }
  return bVar1;
}

Assistant:

bool hasUntestedSections() const {
            if( m_state == Unknown )
                return true;
            for(    SubSections::const_iterator it = m_subSections.begin();
                    it != m_subSections.end();
                    ++it)
                if( (*it)->hasUntestedSections() )
                    return true;
            return false;
        }